

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

HashWriter * __thiscall
HashWriter::operator<<(HashWriter *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *obj)

{
  long lVar1;
  uchar *data;
  uchar *puVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<HashWriter>
            (this,(long)(obj->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(obj->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start);
  data = (obj->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  puVar2 = (obj->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (data != puVar2) {
    CSHA256::Write(&this->ctx,data,(long)puVar2 - (long)data);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

HashWriter& operator<<(const T& obj)
    {
        ::Serialize(*this, obj);
        return *this;
    }